

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O1

void __thiscall AmstradCPC::CRTCBusHandler::~CRTCBusHandler(CRTCBusHandler *this)

{
  void *pvVar1;
  Flywheel *pFVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    pvVar1 = *(void **)((long)&(this->mode3_palette_hits_)._M_elems[3].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&(this->mode3_palette_hits_)._M_elems[3].
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x60);
  lVar3 = 0;
  do {
    pvVar1 = *(void **)((long)&(this->mode1_palette_hits_)._M_elems[3].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&(this->mode1_palette_hits_)._M_elems[3].
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x60);
  lVar3 = 0;
  do {
    pvVar1 = *(void **)((long)((this->mode1_palette_hits_)._M_elems + -1) + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)(this->mode1_palette_hits_)._M_elems + lVar3 + -8) -
                             (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x180);
  pFVar2 = (this->crt_).vertical_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar2 != (Flywheel *)0x0) {
    operator_delete(pFVar2,0x24);
  }
  (this->crt_).vertical_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  pFVar2 = (this->crt_).horizontal_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar2 != (Flywheel *)0x0) {
    operator_delete(pFVar2,0x24);
  }
  (this->crt_).horizontal_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  return;
}

Assistant:

CRTCBusHandler(const uint8_t *ram, InterruptTimer &interrupt_timer) :
			crt_(1024, 1, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red2Green2Blue2),
			ram_(ram),
			interrupt_timer_(interrupt_timer) {
				establish_palette_hits();
				build_mode_table();
				crt_.set_visible_area(Outputs::Display::Rect(0.1072f, 0.1f, 0.842105263157895f, 0.842105263157895f));
				crt_.set_brightness(3.0f / 2.0f);	// As only the values 0, 1 and 2 will be used in each channel,
													// whereas Red2Green2Blue2 defines a range of 0-3.
			}